

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_crypt_ofb
              (mbedtls_aes_context *ctx,size_t length,size_t *iv_off,uchar *iv,uchar *input,
              uchar *output)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = *iv_off;
  if (uVar3 < 0x10) {
    for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
      if ((uVar3 == 0) && (iVar1 = mbedtls_aes_crypt_ecb(ctx,1,iv,iv), iVar1 != 0)) {
        return iVar1;
      }
      output[sVar2] = iv[uVar3] ^ input[sVar2];
      uVar3 = (ulong)((int)uVar3 + 1U & 0xf);
    }
    *iv_off = uVar3;
    iVar1 = 0;
  }
  else {
    iVar1 = -0x21;
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_crypt_ofb( mbedtls_aes_context *ctx,
                           size_t length,
                           size_t *iv_off,
                           unsigned char iv[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = 0;
    size_t n;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( iv_off != NULL );
    AES_VALIDATE_RET( iv != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    n = *iv_off;

    if( n > 15 )
        return( MBEDTLS_ERR_AES_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 )
        {
            ret = mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
            if( ret != 0 )
                goto exit;
        }
        *output++ =  *input++ ^ iv[n];

        n = ( n + 1 ) & 0x0F;
    }

    *iv_off = n;

exit:
    return( ret );
}